

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-printers.cc
# Opt level: O0

void testing::internal::PrintTo(wchar_t *s,ostream *os)

{
  ostream *in_RDI;
  wchar_t *unaff_retaddr;
  
  anon_unknown_36::PrintCStringTo<wchar_t>(unaff_retaddr,in_RDI);
  return;
}

Assistant:

void PrintTo(const wchar_t* s, ostream* os) { PrintCStringTo(s, os); }